

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

Abc_Nam_t * Abc_NamStart(int nObjs,int nAveSize)

{
  int iVar1;
  Abc_Nam_t *pAVar2;
  char *pcVar3;
  int *piVar4;
  Abc_Nam_t *p;
  int nAveSize_local;
  int nObjs_local;
  
  p._4_4_ = nObjs;
  if (nObjs == 0) {
    p._4_4_ = 0x10;
  }
  pAVar2 = (Abc_Nam_t *)calloc(1,0x50);
  pAVar2->nStore = (int)(p._4_4_ * (nAveSize + 1) + 0x10) / 4 << 2;
  pcVar3 = (char *)malloc((long)pAVar2->nStore);
  pAVar2->pStore = pcVar3;
  iVar1 = Abc_PrimeCudd(p._4_4_);
  pAVar2->nBins = iVar1;
  piVar4 = (int *)calloc((long)pAVar2->nBins,4);
  pAVar2->pBins = piVar4;
  Vec_IntGrow(&pAVar2->vInt2Handle,p._4_4_);
  Vec_IntPush(&pAVar2->vInt2Handle,-1);
  Vec_IntGrow(&pAVar2->vInt2Next,p._4_4_);
  Vec_IntPush(&pAVar2->vInt2Next,-1);
  pAVar2->iHandle = 4;
  memset(pAVar2->pStore,0,4);
  pAVar2->nRefs = 1;
  return pAVar2;
}

Assistant:

Abc_Nam_t * Abc_NamStart( int nObjs, int nAveSize )
{
    Abc_Nam_t * p;
    if ( nObjs == 0 )
        nObjs = 16;
    p = ABC_CALLOC( Abc_Nam_t, 1 );
    p->nStore      = ((nObjs * (nAveSize + 1) + 16) / 4) * 4;
    p->pStore      = ABC_ALLOC( char, p->nStore );
    p->nBins       = Abc_PrimeCudd( nObjs );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    // 0th object is unused
    Vec_IntGrow( &p->vInt2Handle, nObjs );  Vec_IntPush( &p->vInt2Handle, -1 );
    Vec_IntGrow( &p->vInt2Next,   nObjs );  Vec_IntPush( &p->vInt2Next,   -1 );
    p->iHandle     = 4;
    memset( p->pStore, 0, 4 );
//Abc_Print( 1, "Starting nam with %d bins.\n", p->nBins );
    // start reference counting
    p->nRefs       = 1;
    return p;
}